

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderConstValue(xmlTextReaderPtr reader)

{
  xmlElementType xVar1;
  xmlGenericErrorFunc p_Var2;
  xmlBufPtr pxVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlTextReaderPtr local_30;
  xmlChar *ret;
  xmlAttrPtr attr;
  xmlNodePtr node;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    if (reader->curnode == (xmlNodePtr)0x0) {
      attr = (xmlAttrPtr)reader->node;
    }
    else {
      attr = (xmlAttrPtr)reader->curnode;
    }
    xVar1 = attr->type;
    if (xVar1 == XML_ATTRIBUTE_NODE) {
      if (((attr->children == (_xmlNode *)0x0) || (attr->children->type != XML_TEXT_NODE)) ||
         (attr->children->next != (_xmlNode *)0x0)) {
        if (reader->buffer == (xmlBufPtr)0x0) {
          pxVar3 = xmlBufCreateSize(100);
          reader->buffer = pxVar3;
          if (reader->buffer == (xmlBufPtr)0x0) {
            pp_Var4 = __xmlGenericError();
            p_Var2 = *pp_Var4;
            ppvVar5 = __xmlGenericErrorContext();
            (*p_Var2)(*ppvVar5,"xmlTextReaderSetup : malloc failed\n");
            return (xmlChar *)0x0;
          }
          xmlBufSetAllocationScheme(reader->buffer,XML_BUFFER_ALLOC_BOUNDED);
        }
        else {
          xmlBufEmpty(reader->buffer);
        }
        xmlBufGetNodeContent(reader->buffer,(xmlNode *)attr);
        local_30 = (xmlTextReaderPtr)xmlBufContent(reader->buffer);
        if (local_30 == (xmlTextReaderPtr)0x0) {
          xmlBufFree(reader->buffer);
          pxVar3 = xmlBufCreateSize(100);
          reader->buffer = pxVar3;
          xmlBufSetAllocationScheme(reader->buffer,XML_BUFFER_ALLOC_BOUNDED);
          local_30 = (xmlTextReaderPtr)0x286339;
        }
        reader_local = local_30;
      }
      else {
        reader_local = (xmlTextReaderPtr)attr->children->content;
      }
    }
    else if ((xVar1 - XML_TEXT_NODE < 2) || (xVar1 - XML_PI_NODE < 2)) {
      reader_local = *(xmlTextReaderPtr *)&attr->atype;
    }
    else if (xVar1 == XML_NAMESPACE_DECL) {
      reader_local = (xmlTextReaderPtr)attr->name;
    }
    else {
      reader_local = (xmlTextReaderPtr)0x0;
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

const xmlChar *
xmlTextReaderConstValue(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;

    switch (node->type) {
        case XML_NAMESPACE_DECL:
	    return(((xmlNsPtr) node)->href);
        case XML_ATTRIBUTE_NODE:{
	    xmlAttrPtr attr = (xmlAttrPtr) node;
	    const xmlChar *ret;

	    if ((attr->children != NULL) &&
	        (attr->children->type == XML_TEXT_NODE) &&
		(attr->children->next == NULL))
		return(attr->children->content);
	    else {
		if (reader->buffer == NULL) {
		    reader->buffer = xmlBufCreateSize(100);
                    if (reader->buffer == NULL) {
                        xmlGenericError(xmlGenericErrorContext,
                                        "xmlTextReaderSetup : malloc failed\n");
                        return (NULL);
                    }
		    xmlBufSetAllocationScheme(reader->buffer,
		                              XML_BUFFER_ALLOC_BOUNDED);
                } else
                    xmlBufEmpty(reader->buffer);
	        xmlBufGetNodeContent(reader->buffer, node);
		ret = xmlBufContent(reader->buffer);
		if (ret == NULL) {
		    /* error on the buffer best to reallocate */
		    xmlBufFree(reader->buffer);
		    reader->buffer = xmlBufCreateSize(100);
		    xmlBufSetAllocationScheme(reader->buffer,
		                              XML_BUFFER_ALLOC_BOUNDED);
		    ret = BAD_CAST "";
		}
		return(ret);
	    }
	    break;
	}
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
	    return(node->content);
	default:
	    break;
    }
    return(NULL);
}